

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O3

void pair1_sock_fini(void *arg)

{
  nni_lmq_fini((nni_lmq *)((long)arg + 0xa8));
  nni_lmq_fini((nni_lmq *)((long)arg + 0x48));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x108));
  nni_pollable_fini((nni_pollable *)((long)arg + 0x118));
  nni_mtx_fini((nni_mtx *)((long)arg + 0x20));
  return;
}

Assistant:

static void
pair1_sock_fini(void *arg)
{
	pair1_sock *s = arg;

	nni_lmq_fini(&s->rmq);
	nni_lmq_fini(&s->wmq);
	nni_pollable_fini(&s->writable);
	nni_pollable_fini(&s->readable);
	nni_mtx_fini(&s->mtx);
}